

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDElementNSImpl.cpp
# Opt level: O0

DOMNode * __thiscall xercesc_4_0::XSDElementNSImpl::cloneNode(XSDElementNSImpl *this,bool deep)

{
  XSDElementNSImpl *this_00;
  DOMNode *newNode;
  bool deep_local;
  XSDElementNSImpl *this_local;
  
  this_00 = (XSDElementNSImpl *)
            operator_new(0xc0,(this->super_DOMElementNSImpl).super_DOMElementImpl.fParent.
                              fOwnerDocument);
  XSDElementNSImpl(this_00,this,deep);
  DOMNodeImpl::callUserDataHandlers
            (&(this->super_DOMElementNSImpl).super_DOMElementImpl.fNode,NODE_CLONED,(DOMNode *)this,
             (DOMNode *)this_00);
  return (DOMNode *)this_00;
}

Assistant:

DOMNode * XSDElementNSImpl::cloneNode(bool deep) const {
    DOMNode* newNode = new (fParent.fOwnerDocument) XSDElementNSImpl(*this, deep);
    fNode.callUserDataHandlers(DOMUserDataHandler::NODE_CLONED, this, newNode);
    return newNode;
}